

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall ValueMapSymbol::restoreXml(ValueMapSymbol *this,Element *el,SleighBase *trans)

{
  uint *puVar1;
  Element *this_00;
  PatternExpression *pPVar2;
  string *psVar3;
  pointer ppEVar4;
  allocator local_1d9;
  ValueMapSymbol *local_1d8;
  intb val;
  istringstream s;
  uint auStack_198 [90];
  
  ppEVar4 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar2 = PatternExpression::restoreExpression(*ppEVar4,&trans->super_Translate);
  (this->super_ValueSymbol).patval = (PatternValue *)pPVar2;
  pPVar2->refcount = pPVar2->refcount + 1;
  local_1d8 = this;
  while (ppEVar4 = ppEVar4 + 1,
        ppEVar4 !=
        (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    this_00 = *ppEVar4;
    std::__cxx11::string::string((string *)&val,"val",&local_1d9);
    psVar3 = Element::getAttributeValue(this_00,(string *)&val);
    std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)psVar3,_S_in);
    std::__cxx11::string::~string((string *)&val);
    puVar1 = (uint *)((long)auStack_198 + *(long *)(_s + -0x18));
    *puVar1 = *puVar1 & 0xffffffb5;
    std::istream::_M_extract<long>((long *)&s);
    std::vector<long,_std::allocator<long>_>::push_back
              (&this->valuetable,(value_type_conflict4 *)&val);
    std::__cxx11::istringstream::~istringstream((istringstream *)&s);
  }
  checkTableFill(local_1d8);
  return;
}

Assistant:

void ValueMapSymbol::restoreXml(const Element *el,SleighBase *trans)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  patval = (PatternValue *) PatternExpression::restoreExpression(*iter,trans);
  patval->layClaim();
  ++iter;
  while(iter != list.end()) {
    istringstream s((*iter)->getAttributeValue("val"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    intb val;
    s >> val;
    valuetable.push_back(val);
    ++iter;
  }
  checkTableFill();
}